

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_decoder.cc
# Opt level: O2

bool __thiscall draco::MetadataDecoder::DecodeName(MetadataDecoder *this,string *name)

{
  DecoderBuffer *this_00;
  bool bVar1;
  ulong in_RAX;
  void *out_data;
  uint8_t name_len;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX & 0xffffffffffffff;
  bVar1 = DecoderBuffer::Decode<unsigned_char>(this->buffer_,(uchar *)((long)&uStack_18 + 7));
  if (bVar1) {
    std::__cxx11::string::resize((ulong)name);
    if (uStack_18._7_1_ == '\0') {
      bVar1 = true;
    }
    else {
      this_00 = this->buffer_;
      out_data = (void *)std::__cxx11::string::at((ulong)name);
      bVar1 = DecoderBuffer::Decode(this_00,out_data,uStack_18 >> 0x38);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool MetadataDecoder::DecodeName(std::string *name) {
  uint8_t name_len = 0;
  if (!buffer_->Decode(&name_len)) {
    return false;
  }
  name->resize(name_len);
  if (name_len == 0) {
    return true;
  }
  if (!buffer_->Decode(&name->at(0), name_len)) {
    return false;
  }
  return true;
}